

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_extract.cpp
# Opt level: O2

void __thiscall
FNodeBuilder::PushConnectingGLSeg
          (FNodeBuilder *this,int subsector,
          TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t> *segs,vertex_t *v1,vertex_t *v2)

{
  glseg_t local_38;
  
  local_38.super_seg_t.sidedef = (side_t *)0x0;
  local_38.super_seg_t.linedef = (line_t_conflict *)0x0;
  local_38.super_seg_t.frontsector = (sector_t_conflict *)0x0;
  local_38.super_seg_t.backsector = (sector_t_conflict *)0x0;
  local_38.Partner = 0xffffffff;
  local_38.super_seg_t.v1 = v1;
  local_38.super_seg_t.v2 = v2;
  TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t>::Push(segs,&local_38);
  return;
}

Assistant:

void FNodeBuilder::PushConnectingGLSeg (int subsector, TArray<glseg_t> &segs, vertex_t *v1, vertex_t *v2)
{
	glseg_t newseg;

	newseg.v1 = v1;
	newseg.v2 = v2;
	newseg.backsector = NULL;
	newseg.frontsector = NULL;
	newseg.linedef = NULL;
	newseg.sidedef = NULL;
	newseg.Partner = DWORD_MAX;
	segs.Push (newseg);
}